

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

void __thiscall
iutest::iu_global_format_stringstream::iu_global_format_stringstream
          (iu_global_format_stringstream *this,string *str)

{
  std::ios::ios((ios *)&(this->super_iu_stringstream).field_0x80);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)this,(string *)&PTR_construction_vtable_24__001304e8,(_Ios_Openmode)str
            );
  *(undefined8 *)&this->super_iu_stringstream = 0x130480;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x80 = 0x1304d0;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x10 = 0x1304a8;
  TestEnv::global_ostream_copyfmt((iu_ostream *)&(this->super_iu_stringstream).field_0x10);
  return;
}

Assistant:

explicit iu_global_format_stringstream(const ::std::string& str)
        : iu_stringstream(str)
    {
#if IUTEST_HAS_STRINGSTREAM || IUTEST_HAS_STRSTREAM
        TestEnv::global_ostream_copyfmt(*this);
#endif
    }